

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_session_save(mbedtls_ssl_session *session,uchar omit_header,uchar *buf,size_t buf_len,
                    size_t *olen)

{
  ulong uVar1;
  size_t sVar2;
  size_t local_58;
  size_t remaining_len;
  size_t used;
  uchar *p;
  size_t *olen_local;
  size_t buf_len_local;
  uchar *buf_local;
  uchar omit_header_local;
  mbedtls_ssl_session *session_local;
  
  remaining_len = 0;
  if (session == (mbedtls_ssl_session *)0x0) {
    session_local._4_4_ = -0x6c00;
  }
  else {
    used = (size_t)buf;
    if ((omit_header == '\0') && (remaining_len = 5, 4 < buf_len)) {
      *(undefined4 *)buf = ssl_serialized_session_header._0_4_;
      buf[4] = ssl_serialized_session_header[4];
      used = (size_t)(buf + 5);
    }
    uVar1 = remaining_len + 1;
    if (buf_len < uVar1) {
      local_58 = 0;
    }
    else {
      *(char *)used = (char)session->tls_version;
      local_58 = buf_len - uVar1;
      used = (size_t)(used + 1);
    }
    if (session->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) {
      sVar2 = ssl_tls12_session_save(session,(uchar *)used,local_58);
      *olen = sVar2 + uVar1;
      if (buf_len < sVar2 + uVar1) {
        session_local._4_4_ = -0x6a00;
      }
      else {
        session_local._4_4_ = 0;
      }
    }
    else {
      session_local._4_4_ = -0x7080;
    }
  }
  return session_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_session_save(const mbedtls_ssl_session *session,
                            unsigned char omit_header,
                            unsigned char *buf,
                            size_t buf_len,
                            size_t *olen)
{
    unsigned char *p = buf;
    size_t used = 0;
    size_t remaining_len;
#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    size_t out_len;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
#endif
    if (session == NULL) {
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    if (!omit_header) {
        /*
         * Add Mbed TLS version identifier
         */
        used += sizeof(ssl_serialized_session_header);

        if (used <= buf_len) {
            memcpy(p, ssl_serialized_session_header,
                   sizeof(ssl_serialized_session_header));
            p += sizeof(ssl_serialized_session_header);
        }
    }

    /*
     * TLS version identifier
     */
    used += 1;
    if (used <= buf_len) {
        *p++ = MBEDTLS_BYTE_0(session->tls_version);
    }

    /* Forward to version-specific serialization routine. */
    remaining_len = (buf_len >= used) ? buf_len - used : 0;
    switch (session->tls_version) {
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        case MBEDTLS_SSL_VERSION_TLS1_2:
            used += ssl_tls12_session_save(session, p, remaining_len);
            break;
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
        case MBEDTLS_SSL_VERSION_TLS1_3:
            ret = ssl_tls13_session_save(session, p, remaining_len, &out_len);
            if (ret != 0 && ret != MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL) {
                return ret;
            }
            used += out_len;
            break;
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */

        default:
            return MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    }

    *olen = used;
    if (used > buf_len) {
        return MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL;
    }

    return 0;
}